

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system_functions.cpp
# Opt level: O0

void duckdb::CurrentDatabaseFunction(DataChunk *input,ExpressionState *state,Vector *result)

{
  ClientContext *pCVar1;
  string *psVar2;
  Value *in_RDX;
  Value val;
  string local_78 [32];
  Value local_58 [64];
  Value *local_18;
  
  local_18 = in_RDX;
  pCVar1 = (ClientContext *)duckdb::ExpressionState::GetContext();
  psVar2 = (string *)duckdb::DatabaseManager::GetDefaultDatabase_abi_cxx11_(pCVar1);
  std::__cxx11::string::string(local_78,psVar2);
  duckdb::Value::Value(local_58,local_78);
  std::__cxx11::string::~string(local_78);
  duckdb::Vector::Reference(local_18);
  duckdb::Value::~Value(local_58);
  return;
}

Assistant:

static void CurrentDatabaseFunction(DataChunk &input, ExpressionState &state, Vector &result) {
	Value val(DatabaseManager::GetDefaultDatabase(state.GetContext()));
	result.Reference(val);
}